

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_color.cpp
# Opt level: O0

void __thiscall Prog::Prog(Prog *this,Theme *theme,ALLEGRO_DISPLAY *display)

{
  long in_RDI;
  int j;
  int i;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  Label *in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  Widget *in_stack_fffffffffffffe38;
  Dialog *in_stack_fffffffffffffe40;
  allocator<char> *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe88;
  ALLEGRO_DISPLAY *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  Dialog *in_stack_fffffffffffffea0;
  long local_140;
  long local_118;
  long local_f0;
  allocator<char> local_e1;
  string local_e0 [100];
  int local_7c;
  int local_78;
  allocator<char> local_71;
  string local_70 [39];
  allocator<char> local_49;
  string local_48 [72];
  
  Dialog::Dialog(in_stack_fffffffffffffea0,
                 (Theme *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                 (int)in_stack_fffffffffffffe88);
  local_f0 = in_RDI + 0x68;
  do {
    VSlider::VSlider((VSlider *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                     in_stack_fffffffffffffe18);
    local_f0 = local_f0 + 0x40;
  } while (local_f0 != in_RDI + 0x528);
  local_118 = in_RDI + 0x528;
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    Label::Label((Label *)in_stack_fffffffffffffe40,(string *)in_stack_fffffffffffffe38,
                 SUB41((uint)in_stack_fffffffffffffe34 >> 0x18,0));
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
    local_118 = local_118 + 0x60;
  } while (local_118 != in_RDI + 0xc48);
  local_140 = in_RDI + 0xc48;
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    Label::Label((Label *)in_stack_fffffffffffffe40,(string *)in_stack_fffffffffffffe38,
                 SUB41((uint)in_stack_fffffffffffffe34 >> 0x18,0));
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    local_140 = local_140 + 0x60;
  } while (local_140 != in_RDI + 0x1368);
  for (local_78 = 0; local_78 < 0x13; local_78 = local_78 + 1) {
    if (local_78 < 0xc) {
      local_7c = local_78 / 3;
    }
    else {
      local_7c = 5;
      if (local_78 < 0x10) {
        local_7c = 4;
      }
    }
    VSlider::VSlider((VSlider *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                     in_stack_fffffffffffffe18);
    VSlider::operator=((VSlider *)in_stack_fffffffffffffe20,
                       (VSlider *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    VSlider::~VSlider((VSlider *)0x109d1a);
    Dialog::add(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    Label::set_text(in_stack_fffffffffffffe20,
                    (string *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator(&local_e1);
    Dialog::add(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
    Dialog::add(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28);
    *(undefined4 *)(in_RDI + 0x1368 + (long)local_78 * 4) = 0;
  }
  return;
}

Assistant:

Prog::Prog(const Theme & theme, ALLEGRO_DISPLAY *display) :
   d(Dialog(theme, display, 640, 480))
{
   for (int i = 0; i < SLIDERS_COUNT; i++) {
      int j = i < 12 ? i / 3 : i < 16 ? 4 : 5;
      sliders[i] = VSlider(1000, 1000);
      d.add(sliders[i], 8 + i * 32 + j * 16, 8, 15, 256);
      labels[i].set_text(names[i]);
      d.add(labels[i], i * 32 + j * 16, 8 + 256, 32, 20);
      d.add(labels2[i], i * 32 + j * 16, 8 + 276, 32, 20);
      previous[i] = 0;
   }
}